

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BN.cpp
# Opt level: O1

BN * __thiscall BN::operator-=(BN *this,BN *bn)

{
  unsigned_short uVar1;
  pointer puVar2;
  pointer puVar3;
  pointer puVar4;
  uint uVar5;
  ulong uVar6;
  long lVar7;
  
  uVar6 = (long)(bn->ba).super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>._M_impl
                .super__Vector_impl_data._M_finish -
          (long)(bn->ba).super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>._M_impl
                .super__Vector_impl_data._M_start;
  if ((ulong)((long)(this->ba).super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>.
                    _M_impl.super__Vector_impl_data._M_finish -
             (long)(this->ba).super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>.
                   _M_impl.super__Vector_impl_data._M_start) < uVar6) {
    std::vector<unsigned_short,_std::allocator<unsigned_short>_>::resize(&this->ba,(long)uVar6 >> 1)
    ;
  }
  puVar4 = (bn->ba).super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>._M_impl.
           super__Vector_impl_data._M_start;
  lVar7 = (long)(bn->ba).super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>._M_impl
                .super__Vector_impl_data._M_finish - (long)puVar4;
  if (lVar7 == 0) {
    uVar6 = 0;
    uVar5 = 0;
  }
  else {
    lVar7 = lVar7 >> 1;
    puVar2 = (this->ba).super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>._M_impl.
             super__Vector_impl_data._M_start;
    puVar3 = (this->ba).super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>._M_impl.
             super__Vector_impl_data._M_finish;
    uVar5 = 0;
    uVar6 = 0;
    do {
      if ((long)puVar3 - (long)puVar2 >> 1 == uVar6) break;
      uVar5 = (uint)puVar2[uVar6] - (uVar5 + puVar4[uVar6]);
      puVar2[uVar6] = (unsigned_short)uVar5;
      uVar5 = uVar5 >> 0x1f;
      uVar6 = uVar6 + 1;
    } while (lVar7 + (ulong)(lVar7 == 0) != uVar6);
  }
  if (uVar5 != 0) {
    puVar4 = (this->ba).super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>._M_impl.
             super__Vector_impl_data._M_start;
    puVar2 = (this->ba).super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>._M_impl.
             super__Vector_impl_data._M_finish;
    do {
      if ((ulong)((long)puVar2 - (long)puVar4 >> 1) <= uVar6) break;
      puVar3 = puVar4 + uVar6;
      uVar1 = *puVar3;
      *puVar3 = *puVar3 - 1;
      if (uVar1 != 0) {
        uVar5 = 0;
      }
      uVar6 = uVar6 + 1;
    } while (uVar5 != 0);
  }
  puVar4 = (this->ba).super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>._M_impl.
           super__Vector_impl_data._M_finish;
  uVar6 = (long)puVar4 -
          (long)(this->ba).super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>.
                _M_impl.super__Vector_impl_data._M_start;
  while ((2 < uVar6 && (puVar4 = puVar4 + -1, *puVar4 == 0))) {
    (this->ba).super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>._M_impl.
    super__Vector_impl_data._M_finish = puVar4;
    uVar6 = uVar6 - 2;
  }
  return this;
}

Assistant:

BN& BN::operator -= (const BN& bn)
{
    if (ba.size() < bn.ba.size())
        ba.resize(bn.ba.size());

    bool flag = 0;
    size_t pos = 0;

    for (; pos < bn.ba.size() && pos < ba.size(); ++pos) {
        bt2s res = static_cast<bt2s>(ba[pos]) - bn.ba[pos] - flag;
        ba[pos] = static_cast<bt>(res);
        flag = (res < 0);
    }

    for (; flag && pos < ba.size(); ++pos) {
        if (ba[pos])
            flag = false;
        --ba[pos];
    }

    Norm(ba);
    return *this;
}